

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O0

native_object_property * __thiscall mjs::native_object::find(native_object *this,char *name)

{
  int iVar1;
  gc_heap *h;
  gc_vector<mjs::native_object::native_object_property> *this_00;
  native_object_property *pnVar2;
  native_object_property *p;
  native_object_property *__end1;
  native_object_property *__begin1;
  gc_vector<mjs::native_object::native_object_property> *__range1;
  char *name_local;
  native_object *this_local;
  
  h = object::heap(&this->super_object);
  this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>,_true>
            ::dereference(&this->native_properties_,h);
  __end1 = gc_vector<mjs::native_object::native_object_property>::begin(this_00);
  pnVar2 = gc_vector<mjs::native_object::native_object_property>::end(this_00);
  while( true ) {
    if (__end1 == pnVar2) {
      return (native_object_property *)0x0;
    }
    iVar1 = strcmp(__end1->name,name);
    if (iVar1 == 0) break;
    __end1 = __end1 + 1;
  }
  return __end1;
}

Assistant:

native_object::native_object_property* native_object::find(const char* name) const {
    for (auto& p: native_properties_.dereference(heap())) {
        if (!strcmp(p.name, name)) {
            return &p;
        }
    }
    return nullptr;
}